

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::SpirVAssembly::SpvAsmComputeShaderInstance::iterate
          (TestStatus *__return_storage_ptr__,SpvAsmComputeShaderInstance *this)

{
  ProgramCollection<vk::ProgramBinary> *this_00;
  deUint32 queueFamilyIndex;
  VkResult VVar1;
  int iVar2;
  VkPhysicalDeviceFeatures *pVVar3;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar4;
  Unique<vk::Handle<(vk::HandleType)8>_> *pUVar5;
  void *pvVar6;
  ComputeShaderSpec *pCVar7;
  DescriptorPoolBuilder *this_01;
  ProgramBinary *binary;
  VkQueue pVVar8;
  void *__s1;
  NotSupportedError *pNVar9;
  int iVar10;
  pointer pSVar11;
  Allocation *pAVar12;
  long lVar13;
  allocator<char> *__a;
  Location LVar14;
  pointer pSVar15;
  uint uVar16;
  ulong uVar17;
  Location LVar18;
  bool bVar19;
  allocator<char> local_2e1;
  Allocation *local_2e0;
  AllocationMp alloc;
  VkSubmitInfo submitInfo;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_228;
  Allocator *local_208;
  VkDevice local_200;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  outputAllocs;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_1d8;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptorInfos;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  outputBuffers;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_158;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_138;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_118;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_f8;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_d8;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  inputBuffers;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_> inputAllocs
  ;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_78;
  string local_50;
  
  pVVar3 = Context::getDeviceFeatures((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_200 = device;
  local_208 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  if (((this->m_features | COMPUTE_TEST_USES_INT64) == COMPUTE_TEST_USES_INT16_INT64) &&
     (pVVar3->shaderInt16 == 0)) {
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&submitInfo,"shaderInt16 feature is not supported",
               (allocator<char> *)&alloc);
    tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)&submitInfo);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (((this->m_features & ~COMPUTE_TEST_USES_INT16) == COMPUTE_TEST_USES_INT64) &&
     (pVVar3->shaderInt64 == 0)) {
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&submitInfo,"shaderInt64 feature is not supported",
               (allocator<char> *)&alloc);
    tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)&submitInfo);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  inputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputAllocs.
  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputBuffers.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorInfos.
  super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar7 = this->m_shaderSpec;
  pSVar15 = (pCVar7->inputs).
            super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar11 = (pCVar7->inputs).
            super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  LVar14 = (Location)
           (((long)(pCVar7->outputs).
                   super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pCVar7->outputs).
                   super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) +
           ((long)pSVar11 - (long)pSVar15 >> 4));
  pAVar12 = (Allocation *)0x0;
  for (uVar17 = 0; uVar17 < (ulong)((long)pSVar11 - (long)pSVar15 >> 4); uVar17 = uVar17 + 1) {
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    local_2e0 = pAVar12;
    sVar4 = (**(code **)(**(long **)((long)&pAVar12->_vptr_Allocation + (long)pSVar15) + 0x10))();
    pUVar5 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
    anon_unknown.dwarf_73a4b0::createBufferAndBindMemory
              ((Move<vk::Handle<(vk::HandleType)8>_> *)&submitInfo,vk,&local_200,local_208,sVar4,
               &alloc);
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device =
         (VkDevice)submitInfo._16_8_;
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         submitInfo._0_8_;
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)submitInfo.pNext;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&submitInfo);
    pAVar12 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
    ;
    pvVar6 = (void *)(**(code **)(**(long **)((long)&local_2e0->_vptr_Allocation + (long)pSVar15) +
                                 0x18))();
    memcpy(pAVar12->m_hostPtr,pvVar6,sVar4);
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)(pAVar12->m_memory).m_internal,pAVar12->m_offset,sVar4);
    submitInfo._0_8_ =
         (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
    submitInfo.pNext = (void *)0x0;
    submitInfo._16_8_ = sVar4;
    std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
    emplace_back<vk::VkDescriptorBufferInfo>(&descriptorInfos,(VkDescriptorBufferInfo *)&submitInfo)
    ;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo,
               pUVar5);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                *)&inputBuffers,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo);
    pAVar12 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
    ;
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    de::SharedPtr<vk::Allocation>::SharedPtr((SharedPtr<vk::Allocation> *)&submitInfo,pAVar12);
    std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
    emplace_back<de::SharedPtr<vk::Allocation>>
              ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                *)&inputAllocs,(SharedPtr<vk::Allocation> *)&submitInfo);
    de::SharedPtr<vk::Allocation>::release((SharedPtr<vk::Allocation> *)&submitInfo);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              (&alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    pCVar7 = this->m_shaderSpec;
    pSVar15 = (pCVar7->inputs).
              super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar11 = (pCVar7->inputs).
              super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pAVar12 = (Allocation *)&local_2e0->m_offset;
  }
  pAVar12 = (Allocation *)0x0;
  for (uVar17 = 0;
      pSVar15 = (pCVar7->outputs).
                super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(pCVar7->outputs).
                             super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15 >> 4);
      uVar17 = uVar17 + 1) {
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    local_2e0 = pAVar12;
    sVar4 = (**(code **)(**(long **)((long)&pAVar12->_vptr_Allocation + (long)pSVar15) + 0x10))();
    pUVar5 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
    anon_unknown.dwarf_73a4b0::createBufferAndBindMemory
              ((Move<vk::Handle<(vk::HandleType)8>_> *)&submitInfo,vk,&local_200,local_208,sVar4,
               (AllocationMp *)
               &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device =
         (VkDevice)submitInfo._16_8_;
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         submitInfo._0_8_;
    (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)submitInfo.pNext;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&submitInfo);
    pAVar12 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
    ;
    memset((alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
           ->m_hostPtr,0xff,sVar4);
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)(pAVar12->m_memory).m_internal,pAVar12->m_offset,sVar4);
    submitInfo._0_8_ =
         (pUVar5->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
    submitInfo.pNext = (void *)0x0;
    submitInfo._16_8_ = sVar4;
    std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
    emplace_back<vk::VkDescriptorBufferInfo>(&descriptorInfos,(VkDescriptorBufferInfo *)&submitInfo)
    ;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo,
               pUVar5);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                *)&outputBuffers,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo);
    pAVar12 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
    ;
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    de::SharedPtr<vk::Allocation>::SharedPtr((SharedPtr<vk::Allocation> *)&submitInfo,pAVar12);
    std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
    emplace_back<de::SharedPtr<vk::Allocation>>
              ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                *)&outputAllocs,(SharedPtr<vk::Allocation> *)&submitInfo);
    de::SharedPtr<vk::Allocation>::release((SharedPtr<vk::Allocation> *)&submitInfo);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              (&alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    pCVar7 = this->m_shaderSpec;
    pAVar12 = (Allocation *)&local_2e0->m_offset;
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&submitInfo);
  LVar18 = LVar14;
  while (bVar19 = LVar18 != (Location)0x0, LVar18 = (Location)((long)LVar18 - 1), bVar19) {
    ::vk::DescriptorSetLayoutBuilder::addSingleBinding
              ((DescriptorSetLayoutBuilder *)&submitInfo,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  }
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&alloc,
             (DescriptorSetLayoutBuilder *)&submitInfo,vk,device,0);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&submitInfo);
  local_d8.m_data.object.m_internal =
       (deUint64)
       alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_d8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&alloc);
  submitInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 1;
  submitInfo.pWaitSemaphores = (VkSemaphore *)&local_118;
  submitInfo.pWaitDstStageMask =
       (VkPipelineStageFlags *)((ulong)submitInfo.pWaitDstStageMask._4_4_ << 0x20);
  local_118.m_data.object.m_internal = local_d8.m_data.object.m_internal;
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&alloc,vk,device,
             (VkPipelineLayoutCreateInfo *)&submitInfo,(VkAllocationCallbacks *)0x0);
  local_f8.m_data.object.m_internal =
       (deUint64)
       alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_f8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  local_f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&alloc);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&alloc);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&alloc,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       LVar14.m_binding);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&submitInfo,this_01,vk,device,1,1);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&alloc);
  local_118.m_data.object.m_internal = submitInfo._0_8_;
  local_118.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  local_118.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_118.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&submitInfo);
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)
       CONCAT44(alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                ptr._4_4_,0x22);
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ = 0;
  local_138.m_data.object.m_internal = local_d8.m_data.object.m_internal;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&local_1d8,vk,device,
             (VkDescriptorSetAllocateInfo *)&alloc);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&submitInfo);
  for (uVar16 = 0; LVar18.m_arrayElement = 0, LVar18.m_binding = uVar16,
      (ulong)LVar18 < (ulong)LVar14; uVar16 = uVar16 + 1) {
    local_228.m_data.object.m_internal = (deUint64)LVar18;
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              ((DescriptorSetUpdateBuilder *)&submitInfo,
               (VkDescriptorSet)local_1d8.m_data.object.m_internal,(Location *)&local_228,
               VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
               descriptorInfos.
               super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)LVar18);
  }
  ::vk::DescriptorSetUpdateBuilder::update((DescriptorSetUpdateBuilder *)&submitInfo,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&submitInfo);
  local_78.m_data.object.m_internal = local_1d8.m_data.object.m_internal;
  local_78.m_data.deleter.m_deviceIface = local_1d8.m_data.deleter.m_deviceIface;
  local_78.m_data.deleter.m_device = local_1d8.m_data.deleter.m_device;
  local_78.m_data.deleter.m_pool.m_internal = (deUint64)local_1d8.m_data.deleter.m_allocator;
  local_1d8.m_data.object.m_internal = 0;
  local_1d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&local_1d8);
  this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
  __a = (allocator<char> *)&alloc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&submitInfo,"compute",__a);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&submitInfo);
  std::__cxx11::string::~string((string *)&submitInfo);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&submitInfo,vk,device,binary,0);
  local_1d8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_1d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_1d8.m_data.object.m_internal = submitInfo._0_8_;
  local_1d8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&submitInfo);
  submitInfo.pCommandBuffers = (VkCommandBuffer *)local_1d8.m_data.object.m_internal;
  pCVar7 = this->m_shaderSpec;
  submitInfo._56_8_ = (pCVar7->entryPoint)._M_dataplus._M_p;
  uVar17 = (long)(pCVar7->specConstants).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pCVar7->specConstants).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  iVar2 = (int)uVar17;
  if (iVar2 == 0) {
    __a = (allocator<char> *)0x0;
  }
  else {
    local_2e0 = (Allocation *)local_f8.m_data.object.m_internal;
    uVar17 = uVar17 & 0xffffffff;
    std::vector<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>::resize
              ((vector<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                *)&cmdBufferBeginInfo,uVar17);
    iVar10 = 0;
    for (lVar13 = 0; uVar17 << 2 != lVar13; lVar13 = lVar13 + 4) {
      *(int *)(cmdBufferBeginInfo._0_8_ + lVar13 * 4) = iVar10;
      *(int *)(cmdBufferBeginInfo._0_8_ + 4 + lVar13 * 4) = (int)lVar13;
      *(undefined8 *)(cmdBufferBeginInfo._0_8_ + 8 + lVar13 * 4) = 4;
      iVar10 = iVar10 + 1;
    }
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)
         CONCAT44(alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                  .ptr._4_4_,iVar2);
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_ =
         cmdBufferBeginInfo.sType;
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_ =
         cmdBufferBeginInfo._4_4_;
  }
  submitInfo.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  submitInfo.pNext = (void *)0x0;
  submitInfo._16_8_ = submitInfo._16_8_ & 0xffffffff00000000;
  submitInfo.pWaitSemaphores = (VkSemaphore *)CONCAT44(submitInfo.pWaitSemaphores._4_4_,0x12);
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0x20;
  submitInfo.pSignalSemaphores = (VkSemaphore *)__a;
  ::vk::createComputePipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_228,vk,device,(VkPipelineCache)0x0,
             (VkComputePipelineCreateInfo *)&submitInfo,(VkAllocationCallbacks *)0x0);
  std::_Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>::
  ~_Vector_base((_Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
                 *)&cmdBufferBeginInfo);
  local_138.m_data.object.m_internal = local_228.m_data.object.m_internal;
  local_138.m_data.deleter.m_deviceIface = local_228.m_data.deleter.m_deviceIface;
  local_138.m_data.deleter.m_device = local_228.m_data.deleter.m_device;
  local_138.m_data.deleter.m_allocator = local_228.m_data.deleter.m_allocator;
  local_228.m_data.object.m_internal._0_4_ = 0;
  local_228.m_data.object.m_internal._4_4_ = 0;
  local_228.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_228.m_data.deleter.m_device = (VkDevice)0x0;
  local_228.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_228);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,0,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)submitInfo._0_8_;
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ =
       submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vk,device,
             (VkCommandPool)
             alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_228.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_228.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_228.m_data.object.m_internal = submitInfo._0_8_;
  local_228.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&submitInfo);
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  pCVar7 = this->m_shaderSpec;
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_228.m_data.object.m_internal);
  ::vk::checkResult(VVar1,"vkdi.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x170);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_228.m_data.object.m_internal,1,local_138.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_228.m_data.object.m_internal,1,local_f8.m_data.object.m_internal,0,1,&local_78
             ,0,0);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,local_228.m_data.object.m_internal,(ulong)(uint)(pCVar7->numWorkGroups).m_data[0],
             (ulong)(uint)(pCVar7->numWorkGroups).m_data[1]);
  VVar1 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_228.m_data.object.m_internal);
  ::vk::checkResult(VVar1,"vkdi.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x174);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_158.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_158.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_158.m_data.object.m_internal = submitInfo._0_8_;
  local_158.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&submitInfo);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_228;
  pVVar8 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar8,1,&submitInfo);
  ::vk::checkResult(VVar1,
                    "vkdi.queueSubmit(m_context.getUniversalQueue(), 1, &submitInfo, *cmdCompleteFence)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x187);
  uVar17 = 0xffffffffffffffff;
  VVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_158,0,0xffffffffffffffff);
  ::vk::checkResult(VVar1,
                    "vkdi.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x188);
  pCVar7 = this->m_shaderSpec;
  if (pCVar7->verifyIO ==
      (_func_bool_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>_ptr_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_TestLog_ptr
       *)0x0) {
    lVar13 = 0;
    do {
      pSVar15 = (this->m_shaderSpec->outputs).
                super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = uVar17 + 1;
      if ((ulong)((long)(this->m_shaderSpec->outputs).
                        super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15 >> 4) <= uVar17)
      goto LAB_0056efb6;
      __s1 = (void *)(**(code **)(**(long **)((long)&pSVar15->m_ptr + lVar13) + 0x18))();
      pvVar6 = *(void **)(*(long *)((long)&(outputAllocs.
                                            super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                   lVar13) + 0x18);
      sVar4 = (**(code **)(**(long **)((long)&pSVar15->m_ptr + lVar13) + 0x10))();
      lVar13 = lVar13 + 0x10;
      iVar2 = bcmp(__s1,pvVar6,sVar4);
    } while (iVar2 == 0);
    pCVar7 = this->m_shaderSpec;
    __return_storage_ptr__->m_code = pCVar7->failResult;
    std::__cxx11::string::string
              ((string *)&__return_storage_ptr__->m_description,(string *)&pCVar7->failMessage);
  }
  else {
    bVar19 = (*pCVar7->verifyIO)(&pCVar7->inputs,&outputAllocs,&pCVar7->outputs,
                                 ((this->super_TestInstance).m_context)->m_testCtx->m_log);
    if (bVar19) {
LAB_0056efb6:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Output match with expected",&local_2e1);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      pCVar7 = this->m_shaderSpec;
      __return_storage_ptr__->m_code = pCVar7->failResult;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->m_description,(string *)&pCVar7->failMessage);
    }
  }
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_158);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_228);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&alloc);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_138);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_1d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_118);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_f8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_d8);
  std::_Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
  ~_Vector_base(&descriptorInfos.
                 super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               );
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::~vector(&outputBuffers);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::~vector(&inputBuffers);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  ~vector(&outputAllocs);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  ~vector(&inputAllocs);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SpvAsmComputeShaderInstance::iterate (void)
{
	const VkPhysicalDeviceFeatures&		features = m_context.getDeviceFeatures();
	const DeviceInterface&				vkdi				= m_context.getDeviceInterface();
	const VkDevice&						device				= m_context.getDevice();
	Allocator&							allocator			= m_context.getDefaultAllocator();

	if ((m_features == COMPUTE_TEST_USES_INT16 || m_features == COMPUTE_TEST_USES_INT16_INT64) && !features.shaderInt16)
	{
		throw tcu::NotSupportedError("shaderInt16 feature is not supported");
	}

	if ((m_features == COMPUTE_TEST_USES_INT64 || m_features == COMPUTE_TEST_USES_INT16_INT64) && !features.shaderInt64)
	{
		throw tcu::NotSupportedError("shaderInt64 feature is not supported");
	}

	vector<AllocationSp>				inputAllocs;
	vector<AllocationSp>				outputAllocs;
	vector<BufferHandleSp>				inputBuffers;
	vector<BufferHandleSp>				outputBuffers;
	vector<VkDescriptorBufferInfo>		descriptorInfos;

	DE_ASSERT(!m_shaderSpec.outputs.empty());
	const size_t						numBuffers			= m_shaderSpec.inputs.size() + m_shaderSpec.outputs.size();

	// Create buffer object, allocate storage, and create view for all input/output buffers.

	for (size_t inputNdx = 0; inputNdx < m_shaderSpec.inputs.size(); ++inputNdx)
	{
		AllocationMp		alloc;
		const BufferSp&		input		= m_shaderSpec.inputs[inputNdx];
		const size_t		numBytes	= input->getNumBytes();
		BufferHandleUp*		buffer		= new BufferHandleUp(createBufferAndBindMemory(vkdi, device, allocator, numBytes, &alloc));

		setMemory(vkdi, device, &*alloc, numBytes, input->data());
		descriptorInfos.push_back(vk::makeDescriptorBufferInfo(**buffer, 0u, numBytes));
		inputBuffers.push_back(BufferHandleSp(buffer));
		inputAllocs.push_back(de::SharedPtr<Allocation>(alloc.release()));
	}

	for (size_t outputNdx = 0; outputNdx < m_shaderSpec.outputs.size(); ++outputNdx)
	{
		AllocationMp		alloc;
		const BufferSp&		output		= m_shaderSpec.outputs[outputNdx];
		const size_t		numBytes	= output->getNumBytes();
		BufferHandleUp*		buffer		= new BufferHandleUp(createBufferAndBindMemory(vkdi, device, allocator, numBytes, &alloc));

		fillMemoryWithValue(vkdi, device, &*alloc, numBytes, 0xff);
		descriptorInfos.push_back(vk::makeDescriptorBufferInfo(**buffer, 0u, numBytes));
		outputBuffers.push_back(BufferHandleSp(buffer));
		outputAllocs.push_back(de::SharedPtr<Allocation>(alloc.release()));
	}

	// Create layouts and descriptor set.

	Unique<VkDescriptorSetLayout>		descriptorSetLayout	(createDescriptorSetLayout(vkdi, device, numBuffers));
	Unique<VkPipelineLayout>			pipelineLayout		(createPipelineLayout(vkdi, device, *descriptorSetLayout));
	Unique<VkDescriptorPool>			descriptorPool		(createDescriptorPool(vkdi, device, (deUint32)numBuffers));
	Unique<VkDescriptorSet>				descriptorSet		(createDescriptorSet(vkdi, device, *descriptorPool, *descriptorSetLayout, numBuffers, descriptorInfos));

	// Create compute shader and pipeline.

	const ProgramBinary&				binary				= m_context.getBinaryCollection().get("compute");
	Unique<VkShaderModule>				module				(createShaderModule(vkdi, device, binary, (VkShaderModuleCreateFlags)0u));

	Unique<VkPipeline>					computePipeline		(createComputePipeline(vkdi, device, *pipelineLayout, *module, m_shaderSpec.entryPoint.c_str(), m_shaderSpec.specConstants));

	// Create command buffer and record commands

	const Unique<VkCommandPool>			cmdPool				(createCommandPool(vkdi, device, m_context.getUniversalQueueFamilyIndex()));
	Unique<VkCommandBuffer>				cmdBuffer			(allocateCommandBuffer(vkdi, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const VkCommandBufferBeginInfo		cmdBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// sType
		DE_NULL,										// pNext
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const tcu::IVec3&				numWorkGroups		= m_shaderSpec.numWorkGroups;

	VK_CHECK(vkdi.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vkdi.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);
	vkdi.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0, 1, &descriptorSet.get(), 0, DE_NULL);
	vkdi.cmdDispatch(*cmdBuffer, numWorkGroups.x(), numWorkGroups.y(), numWorkGroups.z());
	VK_CHECK(vkdi.endCommandBuffer(*cmdBuffer));

	// Create fence and run.

	const Unique<VkFence>			cmdCompleteFence	(createFence(vkdi, device));
	const deUint64					infiniteTimeout		= ~(deUint64)0u;
	const VkSubmitInfo				submitInfo			=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const VkSemaphore*)DE_NULL,
		(const VkPipelineStageFlags*)DE_NULL,
		1u,
		&cmdBuffer.get(),
		0u,
		(const VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vkdi.queueSubmit(m_context.getUniversalQueue(), 1, &submitInfo, *cmdCompleteFence));
	VK_CHECK(vkdi.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)); // \note: timeout is failure

	// Check output.
	if (m_shaderSpec.verifyIO)
	{
		if (!(*m_shaderSpec.verifyIO)(m_shaderSpec.inputs, outputAllocs, m_shaderSpec.outputs, m_context.getTestContext().getLog()))
			return tcu::TestStatus(m_shaderSpec.failResult, m_shaderSpec.failMessage);
	}
	else
	{
		for (size_t outputNdx = 0; outputNdx < m_shaderSpec.outputs.size(); ++outputNdx)
		{
			const BufferSp& expectedOutput = m_shaderSpec.outputs[outputNdx];
			if (deMemCmp(expectedOutput->data(), outputAllocs[outputNdx]->getHostPtr(), expectedOutput->getNumBytes()))
				return tcu::TestStatus(m_shaderSpec.failResult, m_shaderSpec.failMessage);
		}
	}

	return tcu::TestStatus::pass("Output match with expected");
}